

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  sexp_conflict psVar2;
  
  iVar1 = strcmp(version,"0.11.0");
  psVar2 = (sexp_conflict)0xb3e;
  if (iVar1 == 0) {
    iVar1 = strncmp(abi,"cv-gm*uh",8);
    if (iVar1 == 0) {
      sexp_define_foreign_aux
                (ctx,env,"string-hash",2,1,"sexp_string_hash",sexp_string_hash,0x7fffffffffffffff);
      sexp_define_foreign_aux
                (ctx,env,"string-ci-hash",2,1,"sexp_string_ci_hash",sexp_string_ci_hash,
                 0x7fffffffffffffff);
      sexp_define_foreign_aux(ctx,env,"hash",2,1,"sexp_hash",sexp_hash,0x7fffffffffffffff);
      sexp_define_foreign_aux
                (ctx,env,"hash-by-identity",2,1,"sexp_hash_by_identity",sexp_hash_by_identity,
                 0x7fffffffffffffff);
      sexp_define_foreign_aux
                (ctx,env,"hash-table-cell",3,0,"sexp_hash_table_cell",sexp_hash_table_cell,0);
      sexp_define_foreign_aux
                (ctx,env,"hash-table-delete!",2,0,"sexp_hash_table_delete",sexp_hash_table_delete,0)
      ;
      psVar2 = (sexp_conflict)0x43e;
    }
  }
  return psVar2;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;

  sexp_define_foreign_opt(ctx, env, "string-hash", 2, sexp_string_hash, HASH_BOUND);
  sexp_define_foreign_opt(ctx, env, "string-ci-hash", 2, sexp_string_ci_hash, HASH_BOUND);
  sexp_define_foreign_opt(ctx, env, "hash", 2, sexp_hash, HASH_BOUND);
  sexp_define_foreign_opt(ctx, env, "hash-by-identity", 2, sexp_hash_by_identity, HASH_BOUND);
  sexp_define_foreign(ctx, env, "hash-table-cell", 3, sexp_hash_table_cell);
  sexp_define_foreign(ctx, env, "hash-table-delete!", 2, sexp_hash_table_delete);

  return SEXP_VOID;
}